

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_api.c
# Opt level: O0

char * ecs_os_api_module_to_etc(char *module)

{
  char *pcVar1;
  char *file_base;
  ecs_strbuf_t lib;
  char *module_local;
  
  lib._1080_8_ = module;
  memset(&file_base,0,0x440);
  pcVar1 = module_file_base((char *)lib._1080_8_,'-');
  ecs_strbuf_appendstr((ecs_strbuf_t *)&file_base,pcVar1);
  ecs_strbuf_appendstr((ecs_strbuf_t *)&file_base,"/etc");
  (*ecs_os_api.free_)(pcVar1);
  pcVar1 = ecs_strbuf_get((ecs_strbuf_t *)&file_base);
  return pcVar1;
}

Assistant:

static
char* ecs_os_api_module_to_etc(const char *module) {
    ecs_strbuf_t lib = ECS_STRBUF_INIT;

    /* Best guess, use module name with dashes + /etc */
    char *file_base = module_file_base(module, '-');

    ecs_strbuf_appendstr(&lib, file_base);
    ecs_strbuf_appendstr(&lib, "/etc");

    ecs_os_free(file_base);

    return ecs_strbuf_get(&lib);
}